

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,status_type *S)

{
  undefined4 uVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  char local_2b [3];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_2b[1] = 0x28;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b + 1,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  uVar2 = int_math::ceil2<unsigned_int>(0x209);
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      local_2b[0] = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      uVar4 = uVar4 + 1;
      uVar2 = int_math::ceil2<unsigned_int>(0x209);
    } while (uVar4 < uVar2);
  }
  local_2b[2] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_2b + 2,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          out << ' ' << S.r[i];
        out << ')';
        out.flags(flags);
        return out;
      }